

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O1

bool __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Int64(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
        *this,int64_t i64)

{
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  PrettyPrefix(this,kNumberType);
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                     (&((this->
                        super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        ).os_)->stack_,0x15);
  if (pcVar2 == (char *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/itoa.h"
                  ,0x127,"char *rapidjson::internal::i64toa(int64_t, char *)");
  }
  pcVar4 = pcVar2;
  if (i64 < 0) {
    *pcVar2 = '-';
    i64 = -i64;
    pcVar4 = pcVar2 + 1;
  }
  pcVar3 = internal::u64toa(i64,pcVar4);
  pGVar1 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).os_;
  pcVar4 = (pGVar1->stack_).stackTop_;
  if ((ulong)((long)pcVar4 - (long)(pGVar1->stack_).stack_) < ((long)pcVar2 - (long)pcVar3) + 0x15U)
  {
    __assert_fail("GetSize() >= count * sizeof(T)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                  ,0x8b,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                 );
  }
  (pGVar1->stack_).stackTop_ = pcVar4 + (-0x15 - ((long)pcVar2 - (long)pcVar3));
  return true;
}

Assistant:

bool Int64(int64_t i64)     { PrettyPrefix(kNumberType); return Base::EndValue(Base::WriteInt64(i64)); }